

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O2

void __thiscall
QPDF::optimize(QPDF *this,ObjTable *obj,function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  function<int_(QPDFObjectHandle_&)> fStack_38;
  
  std::function<int_(QPDFObjectHandle_&)>::function(&fStack_38,skip_stream_parameters);
  optimize_internal<QPDFWriter::ObjTable>(this,obj,true,&fStack_38);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return;
}

Assistant:

void
QPDF::optimize(
    QPDFWriter::ObjTable const& obj, std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    optimize_internal(obj, true, skip_stream_parameters);
}